

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap_test.cpp
# Opt level: O2

void __thiscall
ot::commissioner::coap::CoapTest_CoapMessageHeader_SerializeDefaultConstructedMessage_Test::
~CoapTest_CoapMessageHeader_SerializeDefaultConstructedMessage_Test
          (CoapTest_CoapMessageHeader_SerializeDefaultConstructedMessage_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(CoapTest, CoapMessageHeader_SerializeDefaultConstructedMessage)
{
    auto      message = std::make_shared<Message>(Type::kAcknowledgment, Code::kGet);
    ByteArray buffer;
    Error     error;

    EXPECT_EQ(message->Serialize(buffer), ErrorCode::kNone);
    EXPECT_EQ(buffer.size(), 4);
    EXPECT_EQ(buffer[0], ((1 << 6) | (utils::to_underlying(message->GetType()) << 4) | 0));
    EXPECT_EQ(buffer[1], utils::to_underlying(message->GetCode()));
    EXPECT_EQ(buffer[2], 0);
    EXPECT_EQ(buffer[3], 0);

    message = Message::Deserialize(error, buffer);
    EXPECT_NE(message, nullptr);
    EXPECT_EQ(error, ErrorCode::kNone);

    EXPECT_EQ(message->GetType(), Type::kAcknowledgment);
    EXPECT_EQ(message->GetCode(), Code::kGet);
}